

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void scm_resize(int64_t w,int64_t h)

{
  cell_map local_30;
  
  scm_stop();
  if (0 < w) {
    width = (int)w;
  }
  if (h < 1) {
    h = (int64_t)(uint)height;
  }
  else {
    height = (int)h;
  }
  cell_map::cell_map(&local_30,width,(int)h);
  cell_map::operator=(&grid,&local_30);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&local_30.cells.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  paint_grid();
  return;
}

Assistant:

void scm_resize(int64_t w, int64_t h)
  {
  scm_stop();
  if (w > 0)
    width = (int)w;
  if (h > 0)
    height = (int)h;
  grid = cell_map(width, height);
  paint_grid();
  }